

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-basic.c
# Opt level: O0

void test_inline_nested(void)

{
  int32_t iVar1;
  int32_t iVar2;
  int iVar3;
  int __fd;
  undefined8 uVar4;
  undefined8 uVar5;
  void *__buf;
  void *__buf_00;
  void *__s1;
  void *__s2;
  ulong uVar6;
  bool bVar7;
  int fd2;
  int fd1;
  int off;
  uint o;
  int unequal;
  uint8_t *expected_data;
  uint8_t *bson_data;
  char *expected_json;
  char *bson_json;
  bson_t third;
  bson_t bar;
  bson_t foo;
  bson_t expected;
  bson_t bcon;
  uint local_3d8;
  uint local_3ac;
  uint local_3a8;
  undefined1 local_380 [128];
  undefined1 local_300 [128];
  undefined1 local_280 [128];
  undefined1 local_200 [4];
  uint local_1fc;
  undefined1 local_180 [4];
  uint local_17c;
  
  bson_init(local_180);
  bson_init(local_200);
  bson_init(local_280);
  bson_init(local_300);
  bson_init(local_380);
  bson_append_utf8(local_380,"hello",0xffffffff,"world");
  bson_append_int32(local_300,"0",0xffffffff,1);
  bson_append_int32(local_300,"1",0xffffffff,2);
  bson_append_document(local_300,"2",0xffffffff,local_380);
  bson_append_array(local_280,"bar",0xffffffff,local_300);
  bson_append_document(local_200,"foo",0xffffffff,local_280);
  uVar4 = bson_bcon_magic();
  iVar1 = bcon_ensure_int32(1);
  uVar5 = bson_bcon_magic();
  iVar2 = bcon_ensure_int32(2);
  bcon_append(local_180,"foo","{","bar","[",uVar4,0xf,iVar1,uVar5,0xf,iVar2,"{","hello","world","}",
              "]","}",0);
  __buf = (void *)bson_get_data(local_180);
  __buf_00 = (void *)bson_get_data(local_200);
  local_3ac = 0xffffffff;
  bVar7 = true;
  if (local_1fc == local_17c) {
    __s1 = (void *)bson_get_data(local_200);
    __s2 = (void *)bson_get_data(local_180);
    iVar3 = memcmp(__s1,__s2,(ulong)local_1fc);
    bVar7 = iVar3 != 0;
  }
  if (!bVar7) {
    bson_destroy(local_180);
    bson_destroy(local_200);
    bson_destroy(local_280);
    bson_destroy(local_300);
    bson_destroy(local_380);
    return;
  }
  uVar4 = bson_as_canonical_extended_json(local_180,0);
  uVar5 = bson_as_canonical_extended_json(local_200,0);
  local_3a8 = 0;
  do {
    if (local_17c <= local_3a8 || local_1fc <= local_3a8) {
LAB_00144a28:
      if (local_3ac == 0xffffffff) {
        if (local_17c < local_1fc) {
          local_3d8 = local_1fc;
        }
        else {
          local_3d8 = local_17c;
        }
        local_3ac = local_3d8 - 1;
      }
      fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",(ulong)local_3ac,uVar4,uVar5);
      iVar3 = open("failure.bad.bson",0x42,0x1a0);
      __fd = open("failure.expected.bson",0x42,0x1a0);
      if (iVar3 == -1) {
        fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-basic.c"
                ,0x1f6,"test_inline_nested","fd1 != -1");
        abort();
      }
      if (__fd == -1) {
        fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-basic.c"
                ,0x1f6,"test_inline_nested","fd2 != -1");
        abort();
      }
      uVar6 = write(iVar3,__buf,(ulong)local_17c);
      if (local_17c != uVar6) {
        fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-basic.c"
                ,0x1f6,"test_inline_nested",
                "(&bcon)->len == bson_write (fd1, bson_data, (&bcon)->len)");
        abort();
      }
      uVar6 = write(__fd,__buf_00,(ulong)local_1fc);
      if (local_1fc != uVar6) {
        fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-basic.c"
                ,0x1f6,"test_inline_nested",
                "(&expected)->len == bson_write (fd2, expected_data, (&expected)->len)");
        abort();
      }
      close(iVar3);
      close(__fd);
      fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-basic.c"
              ,0x1f6,"test_inline_nested","0");
      abort();
    }
    if (*(char *)((long)__buf + (ulong)local_3a8) != *(char *)((long)__buf_00 + (ulong)local_3a8)) {
      local_3ac = local_3a8;
      goto LAB_00144a28;
    }
    local_3a8 = local_3a8 + 1;
  } while( true );
}

Assistant:

static void
test_inline_nested (void)
{
   bson_t bcon, expected, foo, bar, third;

   bson_init (&bcon);
   bson_init (&expected);
   bson_init (&foo);
   bson_init (&bar);
   bson_init (&third);

   bson_append_utf8 (&third, "hello", -1, "world", -1);
   bson_append_int32 (&bar, "0", -1, 1);
   bson_append_int32 (&bar, "1", -1, 2);
   bson_append_document (&bar, "2", -1, &third);
   bson_append_array (&foo, "bar", -1, &bar);
   bson_append_document (&expected, "foo", -1, &foo);

   BCON_APPEND (&bcon,
                "foo",
                "{",
                "bar",
                "[",
                BCON_INT32 (1),
                BCON_INT32 (2),
                "{",
                "hello",
                "world",
                "}",
                "]",
                "}");

   bson_eq_bson (&bcon, &expected);

   bson_destroy (&bcon);
   bson_destroy (&expected);
   bson_destroy (&foo);
   bson_destroy (&bar);
   bson_destroy (&third);
}